

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O2

void __thiscall ByteArray::replaceWord(ByteArray *this,size_t pos,uint w,Endianness endianness)

{
  byte *pbVar1;
  
  if (pos + 1 < this->size_) {
    pbVar1 = this->data_;
    if (endianness == Little) {
      pbVar1[pos] = (byte)w;
      w = w >> 8;
    }
    else {
      pbVar1[pos] = (byte)(w >> 8);
    }
    pbVar1[pos + 1] = (byte)w;
  }
  return;
}

Assistant:

void replaceWord(size_t pos, unsigned int w, Endianness endianness = Endianness::Little)
	{
		if (pos+1 >= this->size()) return;
		unsigned char* d = (unsigned char*) this->data();

		if (endianness == Endianness::Little)
		{
			d[pos+0] = w & 0xFF;
			d[pos+1] = (w >> 8) & 0xFF;
		} else {
			d[pos+0] = (w >> 8) & 0xFF;
			d[pos+1] = w & 0xFF;
		}
	}